

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

void __thiscall diy::Bounds<double>::Bounds(Bounds<double> *this,int dim)

{
  undefined4 in_ESI;
  size_t in_RDI;
  DynamicPoint<double,_4UL> *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  DynamicPoint<double,_4UL>::DynamicPoint
            (unaff_retaddr,in_RDI,(Coordinate_conflict1)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  DynamicPoint<double,_4UL>::DynamicPoint
            (unaff_retaddr,in_RDI,(Coordinate_conflict1)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

Bounds(int dim): min(dim), max(dim)                                 {}